

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

void __thiscall
chaiscript::detail::Dispatch_Function::Dispatch_Function
          (Dispatch_Function *this,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs)

{
  int iVar1;
  pointer psVar2;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *func;
  pointer psVar3;
  const_iterator __end2;
  int t_arity;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range2;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  build_type_infos(&local_30,t_funcs);
  psVar3 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (t_funcs->
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  t_arity = -1;
  if (psVar3 != psVar2) {
    iVar1 = ((psVar3->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->m_arity;
    do {
      t_arity = -1;
      if (iVar1 != ((psVar3->
                    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->m_arity) break;
      psVar3 = psVar3 + 1;
      t_arity = iVar1;
    } while (psVar3 != psVar2);
  }
  dispatch::Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,&local_30,t_arity);
  if (local_30.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dispatch_Function_003d0958;
  (this->m_funcs).
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_funcs->
       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_funcs).
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_funcs->
       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_funcs).
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_funcs->
       super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_funcs->
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_funcs->
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (t_funcs->
  super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

explicit Dispatch_Function(std::vector<Proxy_Function> t_funcs)
          : Proxy_Function_Base(build_type_infos(t_funcs), calculate_arity(t_funcs))
          , m_funcs(std::move(t_funcs)) {
      }